

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx.cpp
# Opt level: O0

int ncnn::gemm_x86_int8(Mat *A,Mat *B,Mat *C,Mat *top_blob,int broadcast_type_C,int transA,
                       int transB,int output_transpose,float alpha,float beta,int constant_TILE_M,
                       int constant_TILE_N,int constant_TILE_K,int nT,Option *opt)

{
  int iVar1;
  int *piVar2;
  long in_RSI;
  size_t in_RDI;
  undefined4 in_R8D;
  int in_R9D;
  undefined4 in_XMM0_Da;
  int in_XMM1_Da;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000030;
  long in_stack_00000038;
  Mat BT_tile_1;
  Mat AT_tile;
  int max_kk_1;
  int k_1;
  int max_jj_1;
  int j_1;
  Mat topT_tile;
  int max_ii;
  int i;
  int K_1;
  int M_1;
  float beta_1;
  float alpha_1;
  int output_transpose_1;
  int transA_1;
  int broadcast_type_C_1;
  int TILE_K_1;
  int TILE_N_1;
  int TILE_M_1;
  int ppi;
  gemm_x86_int8_omp_args args;
  Mat topT;
  Mat BT_tile;
  int max_kk;
  int max_jj;
  int k;
  int j;
  int ppk;
  int ppj;
  int ppjk;
  Mat output_descales;
  float B_int8_scale;
  Mat A_int8_scales;
  int nn_NK;
  Mat BT;
  int w_shift_count;
  bool has_w_shift;
  Mat ATX;
  int nn_K;
  int nn_N;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  int N;
  int K;
  int M;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  int in_stack_0000254c;
  int in_stack_00002550;
  int in_stack_00002554;
  Mat *in_stack_00002558;
  Mat *in_stack_00002560;
  Mat *in_stack_00002568;
  Mat *out_descales;
  int j_00;
  float B_scale;
  Mat *pMVar3;
  Mat *scales;
  float in_stack_fffffffffffff2a4;
  float in_stack_fffffffffffff2a8;
  int in_stack_fffffffffffff2ac;
  Mat *in_stack_fffffffffffff2b0;
  void **ppvVar4;
  int in_stack_fffffffffffff2b8;
  int in_stack_fffffffffffff2bc;
  Mat *in_stack_fffffffffffff2c0;
  Mat *in_stack_fffffffffffff2c8;
  undefined8 in_stack_fffffffffffff2e0;
  int in_stack_fffffffffffff2e8;
  Mat *in_stack_fffffffffffff2f0;
  int in_stack_fffffffffffff2f8;
  int in_stack_fffffffffffff2fc;
  undefined8 in_stack_fffffffffffff300;
  int *in_stack_fffffffffffff310;
  int *in_stack_fffffffffffff318;
  int *in_stack_fffffffffffff320;
  int in_stack_fffffffffffff328;
  int local_c64;
  int local_c60;
  int local_c5c;
  int local_c58;
  undefined4 local_b8c;
  undefined4 local_b88;
  undefined4 local_b84;
  bool local_b75;
  int local_b68;
  int local_b64;
  int local_b60;
  int local_b5c;
  int local_b58;
  int local_b54;
  undefined8 local_b50;
  undefined8 local_b48;
  undefined8 local_b40;
  undefined4 local_b38;
  long *local_b30;
  undefined4 local_b28;
  undefined4 local_b24;
  undefined4 local_b20;
  undefined4 local_b1c;
  undefined4 local_b18;
  undefined8 local_b10;
  void *local_b08;
  int *local_b00;
  long local_af8;
  undefined4 local_af0;
  long *local_ae8;
  undefined4 local_ae0;
  int local_adc;
  undefined4 local_ad8;
  undefined4 local_ad4;
  undefined4 local_ad0;
  long local_ac8;
  undefined8 local_ac0;
  undefined8 local_ab8;
  undefined8 local_ab0;
  undefined4 local_aa8;
  long *local_aa0;
  undefined4 local_a98;
  undefined4 local_a94;
  undefined4 local_a90;
  undefined4 local_a8c;
  undefined4 local_a88;
  undefined8 local_a80;
  void *local_a78;
  int *local_a70;
  long local_a68;
  undefined4 local_a60;
  long *local_a58;
  undefined4 local_a50;
  int local_a4c;
  undefined4 local_a48;
  undefined4 local_a44;
  undefined4 local_a40;
  long local_a38;
  int local_a30;
  int local_a2c;
  int local_a28;
  int local_a24;
  int local_a20;
  int local_a1c;
  void *local_a18;
  int *local_a10;
  ulong local_a08;
  undefined4 local_a00;
  long *local_9f8;
  int local_9f0;
  int local_9ec;
  int local_9e8;
  undefined4 local_9e4;
  undefined4 local_9e0;
  ulong local_9d8;
  int local_9d0;
  int local_9cc;
  int local_9c8;
  int local_9c4;
  int local_9c0;
  int local_9bc;
  undefined4 local_9b8;
  int local_9b4;
  int local_9b0;
  undefined4 local_9ac;
  int local_9a8;
  int local_9a4;
  int local_9a0;
  int local_99c;
  int local_998;
  int local_994;
  int local_990;
  undefined4 local_98c;
  int local_988;
  int local_984;
  undefined4 local_980;
  int local_97c;
  void *local_978;
  int *local_970;
  ulong local_968;
  undefined4 local_960;
  long *local_958;
  int local_950;
  int local_94c;
  int local_948;
  undefined4 local_944;
  int local_940;
  long local_938;
  undefined8 local_930;
  undefined8 local_928;
  undefined8 local_920;
  undefined4 local_918;
  long *local_910;
  undefined4 local_908;
  undefined4 local_904;
  undefined4 local_900;
  undefined4 local_8fc;
  undefined4 local_8f8;
  undefined8 local_8f0;
  void *local_8e8;
  int *local_8e0;
  long local_8d8;
  undefined4 local_8d0;
  long *local_8c8;
  undefined4 local_8c0;
  int local_8bc;
  undefined4 local_8b8;
  undefined4 local_8b4;
  undefined4 local_8b0;
  long local_8a8;
  int local_89c;
  int local_898;
  int local_894;
  int local_890;
  int local_88c;
  int local_888;
  int local_884;
  int local_880;
  int local_87c;
  Mat local_878;
  Mat local_828;
  int local_7dc;
  void *local_7d8;
  int *local_7d0;
  long local_7c8;
  undefined4 local_7c0;
  long *local_7b8;
  undefined4 local_7b0;
  int local_7ac;
  int local_7a8;
  undefined4 local_7a4;
  int local_7a0;
  long local_798;
  undefined4 local_78c;
  undefined4 local_788;
  bool local_771;
  void *local_770;
  int *local_768;
  long local_760;
  undefined4 local_758;
  long *local_750;
  undefined4 local_748;
  int local_744;
  int local_740;
  undefined4 local_73c;
  int local_738;
  long local_730;
  int local_724;
  int local_720;
  int local_71c;
  undefined1 local_718 [8];
  Mat local_710;
  void **local_6c8;
  undefined8 *local_6c0;
  void **local_6b0;
  undefined8 *local_6a0;
  undefined8 *local_690;
  void **local_680;
  void **local_670;
  void **local_660;
  void **local_650;
  Mat *local_640;
  Mat *local_630;
  void **local_620;
  void **local_610;
  void **local_600;
  Mat *local_5f8;
  Mat *local_5f0;
  void **local_5e8;
  void **local_5e0;
  undefined1 local_5d5;
  int local_5d4;
  void **local_5d0;
  undefined8 *local_5c8;
  undefined1 local_5b5;
  int local_5b4;
  void **local_5b0;
  undefined8 *local_5a8;
  undefined1 local_595;
  int local_594;
  void **local_590;
  void **local_588;
  undefined1 local_575;
  int local_574;
  void **local_570;
  undefined8 *local_568;
  undefined4 local_558;
  int local_554;
  undefined8 *local_550;
  void **local_548;
  undefined4 local_540;
  int local_53c;
  undefined8 *local_538;
  void **local_530;
  undefined4 local_528;
  int local_524;
  undefined8 *local_520;
  void **local_518;
  int local_4c0;
  undefined4 local_4bc;
  void **local_4b8;
  int local_4a0;
  undefined4 local_49c;
  void **local_498;
  int local_480;
  undefined4 local_47c;
  Mat *local_478;
  int local_460;
  undefined4 local_45c;
  Mat *local_458;
  int local_440;
  undefined4 local_43c;
  void **local_438;
  int local_420;
  undefined4 local_41c;
  void **local_418;
  int local_400;
  undefined4 local_3fc;
  void **local_3f8;
  int local_3e0;
  undefined4 local_3dc;
  void **local_3d8;
  undefined8 *local_3b8;
  undefined8 *local_398;
  int local_380;
  undefined4 local_37c;
  void **local_378;
  undefined8 *local_358;
  void **local_350;
  void **local_348;
  Mat *local_340;
  Mat *local_338;
  void **local_330;
  long *local_328;
  undefined4 local_31c;
  long local_318;
  void *local_310;
  undefined4 local_304;
  int local_300;
  int local_2fc;
  undefined8 *local_2f8;
  long *local_2f0;
  undefined4 local_2e4;
  ulong local_2e0;
  void *local_2d8;
  undefined4 local_2cc;
  int local_2c8;
  int local_2c4;
  void **local_2c0;
  long *local_2b8;
  undefined4 local_2ac;
  long local_2a8;
  void *local_2a0;
  undefined4 local_294;
  int local_290;
  int local_28c;
  undefined8 *local_288;
  long *local_280;
  undefined4 local_274;
  long local_270;
  void *local_268;
  undefined4 local_25c;
  int local_258;
  int local_254;
  undefined8 *local_250;
  undefined4 local_244;
  long local_240;
  undefined4 local_234;
  long local_230;
  undefined4 local_224;
  long local_220;
  undefined4 local_214;
  long local_210;
  long *local_208;
  undefined4 local_1fc;
  long local_1f8;
  void *local_1f0;
  undefined4 local_1e8;
  int local_1e4;
  void **local_1e0;
  long *local_1d8;
  undefined4 local_1cc;
  long local_1c8;
  void *local_1c0;
  undefined4 local_1b8;
  int local_1b4;
  void **local_1b0;
  long *local_1a8;
  undefined4 local_19c;
  long local_198;
  void *local_190;
  undefined4 local_188;
  int local_184;
  void **local_180;
  void *local_168;
  void *local_138;
  void *local_128;
  void *local_118;
  void *local_108;
  void *local_f8;
  void *local_e8;
  void *local_d8;
  void *local_c8;
  undefined8 local_98;
  undefined8 local_90;
  int local_84;
  int local_80;
  int local_7c;
  void **local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined4 local_58;
  int local_54;
  void **local_50;
  undefined8 local_48;
  undefined8 local_40;
  int local_34;
  Mat *local_30;
  undefined8 local_28;
  undefined8 local_20;
  int local_14;
  Mat *local_10;
  
  if (in_R9D == 0) {
    if (*(int *)(in_RDI + 0x28) == 3) {
      local_b58 = *(int *)(in_RDI + 0x38);
    }
    else {
      local_b58 = *(int *)(in_RDI + 0x30);
    }
    local_b54 = local_b58 * *(int *)(in_RDI + 0x18);
  }
  else {
    local_b54 = *(int *)(in_RDI + 0x2c);
  }
  local_710.refcount._4_4_ = local_b54;
  if (in_R9D == 0) {
    local_b60 = *(int *)(in_RDI + 0x2c);
  }
  else {
    if (*(int *)(in_RDI + 0x28) == 3) {
      local_b5c = *(int *)(in_RDI + 0x38);
    }
    else {
      local_b5c = *(int *)(in_RDI + 0x30);
    }
    local_b60 = local_b5c * *(int *)(in_RDI + 0x18);
  }
  local_710.refcount._0_4_ = local_b60;
  if (in_stack_00000008 == 0) {
    local_b68 = *(int *)(in_RSI + 0x2c);
  }
  else {
    if (*(int *)(in_RSI + 0x28) == 3) {
      local_b64 = *(int *)(in_RSI + 0x38);
    }
    else {
      local_b64 = *(int *)(in_RSI + 0x30);
    }
    local_b68 = local_b64 * *(int *)(in_RSI + 0x18);
  }
  local_710.data._4_4_ = local_b68;
  out_descales = &local_710;
  pMVar3 = (Mat *)(local_718 + 4);
  scales = (Mat *)local_718;
  local_710.elemsize._0_4_ = in_XMM1_Da;
  local_710.elemsize._4_4_ = in_XMM0_Da;
  local_710.elempack = in_R9D;
  local_710._28_4_ = in_R8D;
  local_710._56_8_ = in_RDI;
  get_optimal_tile_mnk_int8
            ((int)((ulong)in_stack_fffffffffffff300 >> 0x20),(int)in_stack_fffffffffffff300,
             in_stack_fffffffffffff2fc,in_stack_fffffffffffff2f8,
             (int)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(int)in_stack_fffffffffffff2f0,
             in_stack_fffffffffffff310,in_stack_fffffffffffff318,in_stack_fffffffffffff320,
             in_stack_fffffffffffff328);
  local_71c = (local_710.refcount._4_4_ + (int)local_710.data + -1) / (int)local_710.data;
  local_720 = (local_710.data._4_4_ + local_718._4_4_ + -1) / (int)local_718._4_4_;
  local_724 = ((int)local_710.refcount + local_718._0_4_ + -1) / (int)local_718._0_4_;
  local_6c8 = &local_770;
  local_770 = (void *)0x0;
  local_768 = (int *)0x0;
  local_760 = 0;
  local_758 = 0;
  local_750 = (long *)0x0;
  local_748 = 0;
  local_744 = 0;
  local_740 = 0;
  local_73c = 0;
  local_738 = 0;
  local_730 = 0;
  local_771 = false;
  if (3 < (int)local_718._0_4_) {
    iVar1 = cpu_support_x86_avx512_vnni();
    local_b75 = true;
    if (iVar1 == 0) {
      iVar1 = cpu_support_x86_avx_vnni();
      local_b75 = iVar1 != 0;
    }
    local_771 = local_b75;
    iVar1 = cpu_support_x86_avx_vnni_int8();
    if (iVar1 != 0) {
      local_771 = false;
    }
  }
  iVar1 = (int)((ulong)in_stack_fffffffffffff2b0 >> 0x20);
  if ((local_771 & 1U) == 0) {
    Mat::create(in_stack_fffffffffffff2c0,in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8,iVar1,
                CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),
                (Allocator *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_00000030));
  }
  else {
    if ((int)local_710.data < 0x10) {
      if ((int)local_710.data < 8) {
        if ((int)local_710.data < 4) {
          local_b8c = 1;
          if (1 < (int)local_710.data) {
            local_b8c = 2;
          }
        }
        else {
          local_b8c = 4;
        }
        local_b88 = local_b8c;
      }
      else {
        local_b88 = 8;
      }
      local_b84 = local_b88;
    }
    else {
      local_b84 = 0x10;
    }
    local_788 = local_b84;
    Mat::create(in_stack_fffffffffffff2c0,in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8,iVar1,
                CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),
                (Allocator *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_00000030));
  }
  local_5e0 = &local_770;
  if (local_770 != (void *)0x0) {
    local_350 = local_5e0;
  }
  if (local_770 != (void *)0x0 && local_730 * local_738 != 0) {
    local_7c = local_718._0_4_ * local_718._4_4_;
    local_80 = ((int)local_710.refcount + -1 + local_718._0_4_) / (int)local_718._0_4_;
    local_84 = (local_710.data._4_4_ + -1 + local_718._4_4_) / (int)local_718._4_4_;
    local_98 = *(undefined8 *)(in_stack_00000038 + 0x10);
    local_78 = &local_7d8;
    local_90 = 1;
    local_7d8 = (void *)0x0;
    local_7d0 = (int *)0x0;
    local_7c8 = 0;
    local_7c0 = 0;
    local_7b8 = (long *)0x0;
    local_7b0 = 0;
    local_7ac = 0;
    local_7a8 = 0;
    local_7a4 = 0;
    local_7a0 = 0;
    local_798 = 0;
    Mat::create(in_stack_fffffffffffff2c0,in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8,
                (int)((ulong)in_stack_fffffffffffff2b0 >> 0x20),
                CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),
                (Allocator *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_00000030));
    local_5e8 = &local_7d8;
    if (local_7d8 != (void *)0x0) {
      local_348 = local_5e8;
    }
    if (local_7d8 != (void *)0x0 && local_798 * local_7a0 != 0) {
      local_7dc = local_720 * local_724;
      local_48 = *(undefined8 *)(in_stack_00000038 + 0x10);
      local_30 = &local_828;
      local_34 = local_710.refcount._4_4_;
      local_40 = 4;
      local_828.data = (void *)0x0;
      local_828.refcount = (int *)0x0;
      local_828.elemsize = 0;
      local_828.elempack = 0;
      local_828.allocator = (Allocator *)0x0;
      local_828.dims = 0;
      local_828.w = 0;
      local_828.h = 0;
      local_828.d = 0;
      local_828.c = 0;
      local_828.cstep = 0;
      Mat::create(in_stack_fffffffffffff2b0,in_stack_fffffffffffff2ac,
                  CONCAT44(in_stack_fffffffffffff2a4,in_stack_00000030),(Allocator *)scales);
      local_5f0 = &local_828;
      if (local_828.data != (void *)0x0) {
        local_340 = local_5f0;
      }
      if (local_828.data != (void *)0x0 && local_828.cstep * (long)local_828.c != 0) {
        compute_B_int8_scale(pMVar3,(float *)out_descales);
        local_28 = *(undefined8 *)(in_stack_00000038 + 0x10);
        local_10 = &local_878;
        local_14 = local_710.refcount._4_4_;
        local_20 = 4;
        local_878.data = (void *)0x0;
        local_878.refcount = (int *)0x0;
        local_878.elemsize = 0;
        local_878.elempack = 0;
        local_878.allocator = (Allocator *)0x0;
        local_878.dims = 0;
        local_878.w = 0;
        local_878.h = 0;
        local_878.d = 0;
        local_878.c = 0;
        local_878.cstep = 0;
        Mat::create(in_stack_fffffffffffff2b0,in_stack_fffffffffffff2ac,
                    CONCAT44(in_stack_fffffffffffff2a4,in_stack_00000030),(Allocator *)scales);
        local_5f8 = &local_878;
        if (local_878.data != (void *)0x0) {
          local_338 = local_5f8;
        }
        if (local_878.data != (void *)0x0 && local_878.cstep * (long)local_878.c != 0) {
          for (local_87c = 0; local_87c < local_7dc; local_87c = local_87c + 1) {
            local_880 = local_87c / local_724;
            local_884 = local_87c % local_724;
            local_888 = local_880 * local_718._4_4_;
            local_88c = local_884 * local_718._0_4_;
            local_894 = local_710.data._4_4_ - local_888;
            piVar2 = std::min<int>(&local_894,(int *)(local_718 + 4));
            local_890 = *piVar2;
            local_89c = (int)local_710.refcount - local_88c;
            piVar2 = std::min<int>(&local_89c,(int *)local_718);
            local_898 = *piVar2;
            local_574 = local_888 / (int)local_718._4_4_;
            local_568 = &local_930;
            local_570 = &local_7d8;
            local_310 = (void *)((long)local_7d8 + local_798 * local_574 * local_7c8);
            local_2f8 = &local_930;
            local_210 = (long)local_7ac * (long)local_7a8 * local_7c8;
            local_524 = local_88c / (int)local_718._0_4_;
            local_518 = &local_8e8;
            local_520 = &local_930;
            local_1f0 = (void *)((long)local_310 + (long)local_7ac * (long)local_524 * local_7c8);
            local_1e0 = &local_8e8;
            local_8a8 = (long)local_7ac;
            local_6c0 = &local_930;
            local_8b0 = 1;
            local_8b4 = 1;
            local_8b8 = 1;
            local_8bc = local_7ac;
            local_8c0 = 2;
            local_8c8 = local_7b8;
            local_8d0 = local_7c0;
            local_8d8 = local_7c8;
            local_8e0 = (int *)0x0;
            local_910 = local_7b8;
            local_1e4 = local_7ac;
            local_1e8 = 1;
            local_1f8 = local_7c8;
            local_1fc = local_7c0;
            local_208 = local_7b8;
            local_214 = 0x10;
            local_2fc = local_7ac;
            local_300 = local_7a8;
            local_304 = local_7a4;
            local_318 = local_7c8;
            local_31c = local_7c0;
            local_328 = local_7b8;
            local_528 = 1;
            local_575 = 1;
            local_930 = 0;
            local_920 = 0;
            local_918 = 0;
            local_908 = 0;
            local_904 = 0;
            local_900 = 0;
            local_8fc = 0;
            local_8f8 = 0;
            local_8f0 = 0;
            local_928 = 0;
            iVar1 = (int)((ulong)out_descales >> 0x20);
            j_00 = (int)((ulong)pMVar3 >> 0x20);
            local_358 = local_6c0;
            local_8e8 = local_1f0;
            if (in_stack_00000008 == 0) {
              transpose_pack_B_tile_quantize
                        ((Mat *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_00000030),scales,j_00,
                         (int)pMVar3,iVar1,(int)out_descales,0.0);
            }
            else {
              pack_B_tile_quantize
                        ((Mat *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_00000030),scales,j_00,
                         (int)pMVar3,iVar1,(int)out_descales,0.0);
            }
            local_6b0 = &local_8e8;
            local_378 = local_6b0;
            if (local_8e0 != (int *)0x0) {
              local_37c = 0xffffffff;
              LOCK();
              local_380 = *local_8e0;
              *local_8e0 = *local_8e0 + -1;
              UNLOCK();
              if (local_380 == 1) {
                if (local_8c8 == (long *)0x0) {
                  local_168 = local_8e8;
                  if (local_8e8 != (void *)0x0) {
                    free(local_8e8);
                  }
                }
                else {
                  (**(code **)(*local_8c8 + 0x18))(local_8c8,local_8e8);
                }
              }
            }
            local_8e8 = (void *)0x0;
            local_8d8 = 0;
            local_8d0 = 0;
            local_8c0 = 0;
            local_8bc = 0;
            local_8b8 = 0;
            local_8b4 = 0;
            local_8b0 = 0;
            local_8a8 = 0;
            local_8e0 = (int *)0x0;
          }
          local_54 = local_718._4_4_ * (int)local_710.data;
          local_70 = *(undefined8 *)(in_stack_00000038 + 0x10);
          local_50 = &local_978;
          local_58 = 1;
          local_68 = 4;
          local_978 = (void *)0x0;
          local_970 = (int *)0x0;
          local_968 = 0;
          local_960 = 0;
          local_958 = (long *)0x0;
          local_950 = 0;
          local_94c = 0;
          local_948 = 0;
          local_944 = 0;
          local_940 = 0;
          local_938 = 0;
          Mat::create(in_stack_fffffffffffff2c0,in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8,
                      (int)((ulong)in_stack_fffffffffffff2b0 >> 0x20),
                      CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),
                      (Allocator *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_00000030));
          local_600 = &local_978;
          if (local_978 != (void *)0x0) {
            local_330 = local_600;
          }
          if (local_978 != (void *)0x0 && local_938 * local_940 != 0) {
            local_998 = (int)local_710.data;
            local_994 = local_718._4_4_;
            local_990 = local_718._0_4_;
            local_98c = local_710._28_4_;
            local_988 = local_710.elempack;
            local_984 = in_stack_00000010;
            local_980 = local_710.elemsize._4_4_;
            local_97c = (int)local_710.elemsize;
            for (local_99c = 0; local_99c < local_71c; local_99c = local_99c + 1) {
              local_9a0 = local_998;
              local_9a4 = local_994;
              local_9a8 = local_990;
              local_9ac = local_98c;
              local_9b0 = local_988;
              local_9b4 = local_984;
              local_9b8 = local_980;
              local_9bc = local_97c;
              if (local_988 == 0) {
                if (*(int *)(local_710._56_8_ + 0x28) == 3) {
                  local_c5c = *(int *)(local_710._56_8_ + 0x38);
                }
                else {
                  local_c5c = *(int *)(local_710._56_8_ + 0x30);
                }
                local_c58 = local_c5c * *(int *)(local_710._56_8_ + 0x18);
              }
              else {
                local_c58 = *(int *)(local_710._56_8_ + 0x2c);
              }
              local_9c0 = local_c58;
              if (local_988 == 0) {
                local_c64 = *(int *)(local_710._56_8_ + 0x2c);
              }
              else {
                if (*(int *)(local_710._56_8_ + 0x28) == 3) {
                  local_c60 = *(int *)(local_710._56_8_ + 0x38);
                }
                else {
                  local_c60 = *(int *)(local_710._56_8_ + 0x30);
                }
                local_c64 = local_c60 * *(int *)(local_710._56_8_ + 0x18);
              }
              local_9c4 = local_c64;
              local_9c8 = local_99c * local_998;
              local_9d0 = local_c58 - local_9c8;
              piVar2 = std::min<int>(&local_9d0,&local_9a0);
              local_9cc = *piVar2;
              local_594 = get_omp_thread_num();
              local_588 = &local_a18;
              local_590 = &local_978;
              local_2d8 = (void *)((long)local_978 + local_938 * local_594 * local_968);
              local_2c0 = &local_a18;
              local_a10 = (int *)0x0;
              local_a08 = local_968;
              local_a00 = local_960;
              local_9f8 = local_958;
              local_9ec = local_94c;
              local_9e8 = local_948;
              local_9e4 = 1;
              local_9e0 = local_944;
              local_220 = (long)local_94c * (long)local_948 * local_968;
              local_9d8 = (local_220 + 0xfU & 0xfffffffffffffff0) / local_968;
              local_9f0 = local_950 + -1;
              if (local_950 == 4) {
                local_9d8 = (long)local_94c * (long)local_948;
              }
              local_224 = 0x10;
              local_2c4 = local_94c;
              local_2c8 = local_948;
              local_2cc = local_944;
              local_2e0 = local_968;
              local_2e4 = local_960;
              local_2f0 = local_958;
              local_595 = 1;
              local_a18 = local_2d8;
              for (local_a1c = 0; local_a1c < local_710.data._4_4_;
                  local_a1c = local_9a4 + local_a1c) {
                local_a24 = local_710.data._4_4_ - local_a1c;
                piVar2 = std::min<int>(&local_a24,&local_9a4);
                local_a20 = *piVar2;
                for (local_a28 = 0; local_a28 < local_9c4; local_a28 = local_9a8 + local_a28) {
                  local_a30 = local_9c4 - local_a28;
                  piVar2 = std::min<int>(&local_a30,&local_9a8);
                  local_a2c = *piVar2;
                  local_5b4 = get_omp_thread_num();
                  local_5a8 = &local_ac0;
                  local_5b0 = &local_770;
                  local_2a0 = (void *)((long)local_770 + local_730 * local_5b4 * local_760);
                  local_288 = &local_ac0;
                  local_230 = (long)local_744 * (long)local_740 * local_760;
                  local_53c = local_a28 / local_9a8;
                  local_530 = &local_a78;
                  local_538 = &local_ac0;
                  local_1c0 = (void *)((long)local_2a0 +
                                      (long)local_744 * (long)local_53c * local_760);
                  local_1b0 = &local_a78;
                  local_a38 = (long)local_744;
                  local_6a0 = &local_ac0;
                  local_5d4 = local_a1c / local_9a4;
                  local_5c8 = &local_b50;
                  local_5d0 = &local_7d8;
                  local_268 = (void *)((long)local_7d8 + local_798 * local_5d4 * local_7c8);
                  local_250 = &local_b50;
                  local_240 = (long)local_7ac * (long)local_7a8 * local_7c8;
                  local_554 = local_a28 / local_9a8;
                  local_548 = &local_b08;
                  local_550 = &local_b50;
                  local_190 = (void *)((long)local_268 +
                                      (long)local_7ac * (long)local_554 * local_7c8);
                  local_180 = &local_b08;
                  local_ac8 = (long)local_7ac;
                  local_690 = &local_b50;
                  local_a40 = 1;
                  local_a44 = 1;
                  local_a48 = 1;
                  local_a4c = local_744;
                  local_a50 = 2;
                  local_a58 = local_750;
                  local_a60 = local_758;
                  local_a68 = local_760;
                  local_a70 = (int *)0x0;
                  local_a88 = 0;
                  local_a8c = 0;
                  local_a90 = 0;
                  local_a94 = 0;
                  local_aa0 = local_750;
                  local_aa8 = 0;
                  local_ab0 = 0;
                  local_ab8 = 0;
                  local_ac0 = 0;
                  local_ad0 = 1;
                  local_ad4 = 1;
                  local_ad8 = 1;
                  local_adc = local_7ac;
                  local_ae0 = 2;
                  local_ae8 = local_7b8;
                  local_af0 = local_7c0;
                  local_af8 = local_7c8;
                  local_b00 = (int *)0x0;
                  local_b30 = local_7b8;
                  local_184 = local_7ac;
                  local_188 = 1;
                  local_198 = local_7c8;
                  local_19c = local_7c0;
                  local_1a8 = local_7b8;
                  local_1b4 = local_744;
                  local_1b8 = 1;
                  local_1c8 = local_760;
                  local_1cc = local_758;
                  local_1d8 = local_750;
                  local_234 = 0x10;
                  local_244 = 0x10;
                  local_254 = local_7ac;
                  local_258 = local_7a8;
                  local_25c = local_7a4;
                  local_270 = local_7c8;
                  local_274 = local_7c0;
                  local_280 = local_7b8;
                  local_28c = local_744;
                  local_290 = local_740;
                  local_294 = local_73c;
                  local_2a8 = local_760;
                  local_2ac = local_758;
                  local_2b8 = local_750;
                  local_540 = 1;
                  local_558 = 1;
                  local_5b5 = 1;
                  local_5d5 = 1;
                  local_a80 = 0;
                  local_a98 = 0;
                  local_b50 = 0;
                  local_b40 = 0;
                  local_b38 = 0;
                  local_b28 = 0;
                  local_b24 = 0;
                  local_b20 = 0;
                  local_b1c = 0;
                  local_b18 = 0;
                  local_b10 = 0;
                  local_b48 = 0;
                  local_3b8 = local_690;
                  local_398 = local_6a0;
                  local_b08 = local_190;
                  local_a78 = local_1c0;
                  if (local_a1c == 0) {
                    if (local_a28 == 0) {
                      B_scale = (float)((ulong)pMVar3 >> 0x20);
                      if (local_9b0 == 0) {
                        compute_A_tile_int8_scales
                                  ((Mat *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_00000030),
                                   scales,B_scale,out_descales,0,0x18c9208);
                      }
                      else {
                        transpose_compute_A_tile_int8_scales
                                  ((Mat *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_00000030),
                                   scales,B_scale,out_descales,0,0x18c9077);
                      }
                    }
                    iVar1 = (int)((ulong)pMVar3 >> 0x20);
                    if (local_9b0 == 0) {
                      out_descales = &local_828;
                      pack_A_tile_quantize
                                ((Mat *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_00000030),scales
                                 ,iVar1,(int)pMVar3,(int)((ulong)out_descales >> 0x20),
                                 (int)out_descales,in_stack_fffffffffffff2b0);
                    }
                    else {
                      out_descales = &local_828;
                      transpose_pack_A_tile_quantize
                                ((Mat *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_00000030),scales
                                 ,iVar1,(int)pMVar3,(int)((ulong)out_descales >> 0x20),
                                 (int)out_descales,in_stack_fffffffffffff2b0);
                    }
                  }
                  scales = (Mat *)CONCAT44((int)((ulong)scales >> 0x20),local_a2c);
                  pMVar3 = (Mat *)CONCAT44((int)((ulong)pMVar3 >> 0x20),local_a28);
                  out_descales = (Mat *)CONCAT44((int)((ulong)out_descales >> 0x20),local_a20);
                  gemm_transB_packed_tile_int8
                            (in_stack_00002568,in_stack_00002560,in_stack_00002558,in_stack_00002554
                             ,in_stack_00002550,in_stack_0000254c,local_a28,local_a2c,
                             in_stack_00000030);
                  ppvVar4 = &local_b08;
                  local_680 = ppvVar4;
                  local_3d8 = ppvVar4;
                  if (local_b00 != (int *)0x0) {
                    local_3dc = 0xffffffff;
                    LOCK();
                    local_3e0 = *local_b00;
                    *local_b00 = *local_b00 + -1;
                    UNLOCK();
                    if (local_3e0 == 1) {
                      if (local_ae8 == (long *)0x0) {
                        local_138 = local_b08;
                        if (local_b08 != (void *)0x0) {
                          free(local_b08);
                        }
                      }
                      else {
                        (**(code **)(*local_ae8 + 0x18))(local_ae8,local_b08);
                      }
                    }
                  }
                  *ppvVar4 = (void *)0x0;
                  ppvVar4[2] = (void *)0x0;
                  *(undefined4 *)(ppvVar4 + 3) = 0;
                  *(undefined4 *)(ppvVar4 + 5) = 0;
                  *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
                  *(undefined4 *)(ppvVar4 + 6) = 0;
                  *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
                  *(undefined4 *)(ppvVar4 + 7) = 0;
                  ppvVar4[8] = (void *)0x0;
                  ppvVar4[1] = (void *)0x0;
                  ppvVar4 = &local_a78;
                  local_670 = ppvVar4;
                  local_3f8 = ppvVar4;
                  if (local_a70 != (int *)0x0) {
                    local_3fc = 0xffffffff;
                    LOCK();
                    local_400 = *local_a70;
                    *local_a70 = *local_a70 + -1;
                    UNLOCK();
                    if (local_400 == 1) {
                      if (local_a58 == (long *)0x0) {
                        local_128 = local_a78;
                        if (local_a78 != (void *)0x0) {
                          free(local_a78);
                        }
                      }
                      else {
                        (**(code **)(*local_a58 + 0x18))(local_a58,local_a78);
                      }
                    }
                  }
                  *ppvVar4 = (void *)0x0;
                  ppvVar4[2] = (void *)0x0;
                  *(undefined4 *)(ppvVar4 + 3) = 0;
                  *(undefined4 *)(ppvVar4 + 5) = 0;
                  *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
                  *(undefined4 *)(ppvVar4 + 6) = 0;
                  *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
                  *(undefined4 *)(ppvVar4 + 7) = 0;
                  ppvVar4[8] = (void *)0x0;
                  ppvVar4[1] = (void *)0x0;
                }
                scales = &local_878;
                pMVar3 = (Mat *)CONCAT44((int)((ulong)pMVar3 >> 0x20),local_a20);
                out_descales = (Mat *)CONCAT44((int)((ulong)out_descales >> 0x20),local_a1c);
                in_stack_00000030 = local_9b4;
                unpack_output_tile_dequantize
                          (in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0,
                           (Mat *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8),
                           (int)((ulong)in_stack_fffffffffffff2b0 >> 0x20),
                           (int)in_stack_fffffffffffff2b0,in_stack_fffffffffffff2ac,
                           (int)in_stack_fffffffffffff2e0,in_stack_fffffffffffff2e8,
                           in_stack_fffffffffffff2f0,in_stack_fffffffffffff2a8,
                           in_stack_fffffffffffff2a4,in_stack_fffffffffffff2f8);
              }
              ppvVar4 = &local_a18;
              local_660 = ppvVar4;
              local_418 = ppvVar4;
              if (local_a10 != (int *)0x0) {
                local_41c = 0xffffffff;
                LOCK();
                local_420 = *local_a10;
                *local_a10 = *local_a10 + -1;
                UNLOCK();
                if (local_420 == 1) {
                  if (local_9f8 == (long *)0x0) {
                    local_118 = local_a18;
                    if (local_a18 != (void *)0x0) {
                      free(local_a18);
                    }
                  }
                  else {
                    (**(code **)(*local_9f8 + 0x18))(local_9f8,local_a18);
                  }
                }
              }
              *ppvVar4 = (void *)0x0;
              ppvVar4[2] = (void *)0x0;
              *(undefined4 *)(ppvVar4 + 3) = 0;
              *(undefined4 *)(ppvVar4 + 5) = 0;
              *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
              *(undefined4 *)(ppvVar4 + 6) = 0;
              *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
              *(undefined4 *)(ppvVar4 + 7) = 0;
              ppvVar4[8] = (void *)0x0;
              ppvVar4[1] = (void *)0x0;
            }
            local_710.cstep._4_4_ = 0;
          }
          else {
            local_710.cstep._4_4_ = -100;
          }
          local_78c = 1;
          ppvVar4 = &local_978;
          local_650 = ppvVar4;
          local_438 = ppvVar4;
          if (local_970 != (int *)0x0) {
            local_43c = 0xffffffff;
            LOCK();
            local_440 = *local_970;
            *local_970 = *local_970 + -1;
            UNLOCK();
            if (local_440 == 1) {
              if (local_958 == (long *)0x0) {
                local_108 = local_978;
                if (local_978 != (void *)0x0) {
                  free(local_978);
                }
              }
              else {
                (**(code **)(*local_958 + 0x18))(local_958,local_978);
              }
            }
          }
          *ppvVar4 = (void *)0x0;
          ppvVar4[2] = (void *)0x0;
          *(undefined4 *)(ppvVar4 + 3) = 0;
          *(undefined4 *)(ppvVar4 + 5) = 0;
          *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
          *(undefined4 *)(ppvVar4 + 6) = 0;
          *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
          *(undefined4 *)(ppvVar4 + 7) = 0;
          ppvVar4[8] = (void *)0x0;
          ppvVar4[1] = (void *)0x0;
        }
        else {
          local_710.cstep._4_4_ = -100;
          local_78c = 1;
        }
        pMVar3 = &local_878;
        local_640 = pMVar3;
        local_458 = pMVar3;
        if (local_878.refcount != (int *)0x0) {
          local_45c = 0xffffffff;
          LOCK();
          local_460 = *local_878.refcount;
          *local_878.refcount = *local_878.refcount + -1;
          UNLOCK();
          if (local_460 == 1) {
            if (local_878.allocator == (Allocator *)0x0) {
              local_f8 = local_878.data;
              if (local_878.data != (void *)0x0) {
                free(local_878.data);
              }
            }
            else {
              (*(local_878.allocator)->_vptr_Allocator[3])(local_878.allocator,local_878.data);
            }
          }
        }
        pMVar3->data = (void *)0x0;
        pMVar3->elemsize = 0;
        pMVar3->elempack = 0;
        pMVar3->dims = 0;
        pMVar3->w = 0;
        pMVar3->h = 0;
        pMVar3->d = 0;
        pMVar3->c = 0;
        pMVar3->cstep = 0;
        pMVar3->refcount = (int *)0x0;
      }
      else {
        local_710.cstep._4_4_ = -100;
        local_78c = 1;
      }
      local_630 = &local_828;
      local_478 = local_630;
      if (local_828.refcount != (int *)0x0) {
        local_47c = 0xffffffff;
        LOCK();
        local_480 = *local_828.refcount;
        *local_828.refcount = *local_828.refcount + -1;
        UNLOCK();
        if (local_480 == 1) {
          if (local_828.allocator == (Allocator *)0x0) {
            local_e8 = local_828.data;
            if (local_828.data != (void *)0x0) {
              free(local_828.data);
            }
          }
          else {
            (*(local_828.allocator)->_vptr_Allocator[3])(local_828.allocator,local_828.data);
          }
        }
      }
      local_828.data = (void *)0x0;
      local_828.elemsize = 0;
      local_828.elempack = 0;
      local_828.dims = 0;
      local_828.w = 0;
      local_828.h = 0;
      local_828.d = 0;
      local_828.c = 0;
      local_828.cstep = 0;
      local_828.refcount = (int *)0x0;
    }
    else {
      local_710.cstep._4_4_ = -100;
      local_78c = 1;
    }
    ppvVar4 = &local_7d8;
    local_620 = ppvVar4;
    local_498 = ppvVar4;
    if (local_7d0 != (int *)0x0) {
      local_49c = 0xffffffff;
      LOCK();
      local_4a0 = *local_7d0;
      *local_7d0 = *local_7d0 + -1;
      UNLOCK();
      if (local_4a0 == 1) {
        if (local_7b8 == (long *)0x0) {
          local_d8 = local_7d8;
          if (local_7d8 != (void *)0x0) {
            free(local_7d8);
          }
        }
        else {
          (**(code **)(*local_7b8 + 0x18))(local_7b8,local_7d8);
        }
      }
    }
    *ppvVar4 = (void *)0x0;
    ppvVar4[2] = (void *)0x0;
    *(undefined4 *)(ppvVar4 + 3) = 0;
    *(undefined4 *)(ppvVar4 + 5) = 0;
    *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
    *(undefined4 *)(ppvVar4 + 6) = 0;
    *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
    *(undefined4 *)(ppvVar4 + 7) = 0;
    ppvVar4[8] = (void *)0x0;
    ppvVar4[1] = (void *)0x0;
  }
  else {
    local_710.cstep._4_4_ = -100;
    local_78c = 1;
  }
  ppvVar4 = &local_770;
  if (local_768 != (int *)0x0) {
    local_4bc = 0xffffffff;
    LOCK();
    local_4c0 = *local_768;
    *local_768 = *local_768 + -1;
    UNLOCK();
    if (local_4c0 == 1) {
      local_610 = ppvVar4;
      local_4b8 = ppvVar4;
      if (local_750 == (long *)0x0) {
        local_c8 = local_770;
        if (local_770 != (void *)0x0) {
          free(local_770);
        }
      }
      else {
        (**(code **)(*local_750 + 0x18))(local_750,local_770);
      }
    }
  }
  *ppvVar4 = (void *)0x0;
  ppvVar4[2] = (void *)0x0;
  *(undefined4 *)(ppvVar4 + 3) = 0;
  *(undefined4 *)(ppvVar4 + 5) = 0;
  *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
  *(undefined4 *)(ppvVar4 + 6) = 0;
  *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
  *(undefined4 *)(ppvVar4 + 7) = 0;
  ppvVar4[8] = (void *)0x0;
  ppvVar4[1] = (void *)0x0;
  return local_710.cstep._4_4_;
}

Assistant:

static int gemm_x86_int8(const Mat& A, const Mat& B, const Mat& C, Mat& top_blob, int broadcast_type_C, int transA, int transB, int output_transpose, float alpha, float beta, int constant_TILE_M, int constant_TILE_N, int constant_TILE_K, int nT, const Option& opt)
{
    // NCNN_LOGE("gemm_x86_int8");

    const int M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
    const int K = transA ? (A.dims == 3 ? A.c : A.h) * A.elempack : A.w;
    const int N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;

    // NCNN_LOGE("M/N/K = %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk_int8(M, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, nT);

    // NCNN_LOGE("TILE M/N/K = %d %d %d", TILE_M, TILE_N, TILE_K);

    int nn_M = (M + TILE_M - 1) / TILE_M;
    int nn_N = (N + TILE_N - 1) / TILE_N;
    int nn_K = (K + TILE_K - 1) / TILE_K;

    Mat ATX;
#if NCNN_AVX512VNNI || NCNN_AVXVNNI
    bool has_w_shift = false;
    if (TILE_K >= 4)
    {
        has_w_shift = ncnn::cpu_support_x86_avx512_vnni() || ncnn::cpu_support_x86_avx_vnni();
#if NCNN_AVXVNNIINT8
        if (ncnn::cpu_support_x86_avx_vnni_int8())
            has_w_shift = false;
#endif // NCNN_AVXVNNIINT8
    }
    if (has_w_shift)
    {
        int w_shift_count = TILE_M >= 16 ? 16 : TILE_M >= 8 ? 8 : TILE_M >= 4 ? 4 : TILE_M >= 2 ? 2 : 1;
        ATX.create((TILE_K + w_shift_count * 4) * TILE_M, (K + TILE_K - 1) / TILE_K, nT, 1u, opt.workspace_allocator);
    }
    else
#endif // NCNN_AVX512VNNI || NCNN_AVXVNNI
    {
        ATX.create(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, nT, 1u, opt.workspace_allocator);
    }
    if (ATX.empty())
        return -100;
    Mat BT(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 1u, opt.workspace_allocator);
    if (BT.empty())
        return -100;

    const int nn_NK = nn_N * nn_K;

    Mat A_int8_scales(M, 4u, opt.workspace_allocator);
    if (A_int8_scales.empty())
        return -100;

    // dynamic quantize B
    float B_int8_scale;
    compute_B_int8_scale(B, B_int8_scale);

    // const float output_descale = 1.f / (A_int8_scale * B_int8_scale);
    Mat output_descales(M, 4u, opt.workspace_allocator);
    if (output_descales.empty())
        return -100;

    // NCNN_LOGE("arm ds %f %f", 1/A_int8_scale, 1/B_int8_scale);

    // pack B
    #pragma omp parallel for num_threads(nT)
    for (int ppjk = 0; ppjk < nn_NK; ppjk++)
    {
        const int ppj = ppjk / nn_K;
        const int ppk = ppjk % nn_K;

        const int j = ppj * TILE_N;
        const int k = ppk * TILE_K;

        const int max_jj = std::min((N - j), TILE_N);
        const int max_kk = std::min((K - k), TILE_K);

        Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

        if (transB)
            pack_B_tile_quantize(B, BT_tile, j, max_jj, k, max_kk, B_int8_scale);
        else
            transpose_pack_B_tile_quantize(B, BT_tile, j, max_jj, k, max_kk, B_int8_scale);
    }

    Mat topT(TILE_N * TILE_M, 1, nT, 4u, opt.workspace_allocator);
    if (topT.empty())
        return -100;

    const struct gemm_x86_int8_omp_args args = {TILE_M, TILE_N, TILE_K, broadcast_type_C, transA, output_transpose, alpha, beta};

    #pragma omp parallel for num_threads(nT)
    for (int ppi = 0; ppi < nn_M; ppi++)
    {
        // shadowed variable for less openmp task args
        const int TILE_M = args.TILE_M;
        const int TILE_N = args.TILE_N;
        const int TILE_K = args.TILE_K;
        const int broadcast_type_C = args.broadcast_type_C;
        const int transA = args.transA;
        const int output_transpose = args.output_transpose;
        const float alpha = args.alpha;
        const float beta = args.beta;
        // const int input_elemtype = args.input_elemtype;
        // const int output_elemtype = args.output_elemtype;

        const int M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        const int K = transA ? (A.dims == 3 ? A.c : A.h) * A.elempack : A.w;

        const int i = ppi * TILE_M;

        const int max_ii = std::min((M - i), TILE_M);

        Mat topT_tile = topT.channel(get_omp_thread_num());

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                // NCNN_LOGE("max_ii/jj/kk = %d %d %d", max_ii, max_jj, max_kk);

                Mat AT_tile = ATX.channel(get_omp_thread_num()).row_range(k / TILE_K, 1);

                Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

                if (j == 0)
                {
                    if (k == 0)
                    {
                        if (transA)
                            transpose_compute_A_tile_int8_scales(A, A_int8_scales, B_int8_scale, output_descales, i, max_ii);
                        else
                            compute_A_tile_int8_scales(A, A_int8_scales, B_int8_scale, output_descales, i, max_ii);

                        // NCNN_LOGE("A_int8_scales %f  B_int8_scale %f", A_int8_scales[0], B_int8_scale);
                    }

                    if (transA)
                        transpose_pack_A_tile_quantize(A, AT_tile, i, max_ii, k, max_kk, A_int8_scales);
                    else
                        pack_A_tile_quantize(A, AT_tile, i, max_ii, k, max_kk, A_int8_scales);
                }

                gemm_transB_packed_tile_int8(AT_tile, BT_tile, topT_tile, i, max_ii, j, max_jj, k, max_kk);
            }

            unpack_output_tile_dequantize(topT_tile, C, top_blob, broadcast_type_C, i, max_ii, j, max_jj, output_descales, alpha, beta, output_transpose);
        }
    }

    return 0;
}